

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::visitArrayNewFixed(FunctionValidator *this,ArrayNewFixed *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  bool bVar2;
  Expression **ppEVar3;
  Type local_58 [2];
  HeapType local_48;
  HeapType heapType;
  Iterator __begin1;
  
  shouldBeTrue<wasm::ArrayNewFixed*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "array.init requires gc [--enable-gc]");
  if ((curr->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id != 1) {
    local_48 = wasm::Type::getHeapType
                         (&(curr->super_SpecificExpression<(wasm::Expression::Id)65>).
                           super_Expression.type);
    bVar2 = HeapType::isArray(&local_48);
    bVar2 = shouldBeTrue<wasm::ArrayNewFixed*>(this,bVar2,curr,"array.init heap type must be array")
    ;
    if (bVar2) {
      HeapType::getArray((HeapType *)local_58);
      __begin1.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar1 = (ArenaVector<wasm::Expression_*> *)
               (curr->values).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      heapType.id = (uintptr_t)&curr->values;
      while ((__begin1.parent != pAVar1 || ((ExpressionList *)heapType.id != &curr->values))) {
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)&heapType);
        shouldBeSubType(this,(Type)((*ppEVar3)->type).id,local_58[0],(Expression *)curr,
                        "array.init value must have proper type");
        __begin1.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin1.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayNewFixed(ArrayNewFixed* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.init requires gc [--enable-gc]");
  if (curr->type == Type::unreachable) {
    return;
  }
  auto heapType = curr->type.getHeapType();
  if (!shouldBeTrue(
        heapType.isArray(), curr, "array.init heap type must be array")) {
    return;
  }
  const auto& element = heapType.getArray().element;
  for (auto* value : curr->values) {
    shouldBeSubType(value->type,
                    element.type,
                    curr,
                    "array.init value must have proper type");
  }
}